

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<bool> *
testing::internal::ActionResultHolder<bool>::
PerformAction<bool(solitaire::archivers::interfaces::Snapshot_const&)>
          (Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)> *action,
          ArgumentTuple *args)

{
  ArgumentTuple *this;
  Result value;
  ActionResultHolder<bool> *this_00;
  tuple<const_solitaire::archivers::interfaces::Snapshot_&> local_28;
  Wrapper local_19;
  tuple<const_solitaire::archivers::interfaces::Snapshot_&> *local_18;
  ArgumentTuple *args_local;
  Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this_00 = (ActionResultHolder<bool> *)operator_new(0x10);
  this = args_local;
  std::tuple<const_solitaire::archivers::interfaces::Snapshot_&>::tuple(&local_28,local_18);
  value = Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)>::Perform
                    ((Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)> *)this,
                     &local_28);
  ReferenceOrValueWrapper<bool>::ReferenceOrValueWrapper(&local_19,value);
  ActionResultHolder(this_00,local_19);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }